

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sprite.cpp
# Opt level: O0

uint8_t __thiscall Sprite::get_pixel(Sprite *this,uint8_t tile_id,uint8_t x,uint8_t y)

{
  ulong uVar1;
  ulong __n;
  byte *pbVar2;
  bool lsb;
  size_t byte_index;
  size_t pixel_index;
  uint8_t y_local;
  uint8_t x_local;
  uint8_t tile_id_local;
  Sprite *this_local;
  
  uVar1 = (ulong)(int)((uint)tile_id * 0x40 + (uint)y * 8 + (uint)x);
  __n = uVar1 >> 1;
  if ((uVar1 & 1) == 0) {
    pbVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(&this->_data,__n);
    this_local._7_1_ = (byte)((int)(*pbVar2 & 0xf0) >> 4);
  }
  else {
    pbVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(&this->_data,__n);
    this_local._7_1_ = *pbVar2 & 0xf;
  }
  return this_local._7_1_;
}

Assistant:

uint8_t Sprite::get_pixel(uint8_t tile_id, uint8_t x, uint8_t y)
{
    size_t pixel_index = ((tile_id * 64) + (y*8) + x);
    size_t byte_index = pixel_index / 2;
    bool lsb = pixel_index % 2;

    if(lsb)
        return _data.at(byte_index) & 0x0F;
    else
        return (_data.at(byte_index) & 0xF0) >> 4;
}